

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_byte_array_stop_encode(cram_slice *slice,cram_codec *c,char *in,int in_size)

{
  uchar uVar1;
  ulong uVar2;
  uchar *puVar3;
  cram_block *pcVar4;
  ulong uVar5;
  size_t __size;
  size_t sVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  
  sVar6 = (size_t)in_size;
  pcVar4 = c->out;
  while( true ) {
    uVar2 = pcVar4->alloc;
    if (pcVar4->byte + sVar6 < uVar2) break;
    auVar8._8_4_ = (int)(uVar2 >> 0x20);
    auVar8._0_8_ = uVar2;
    auVar8._12_4_ = 0x45300000;
    dVar10 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 1.5;
    uVar5 = (ulong)dVar10;
    __size = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
    if (uVar2 == 0) {
      __size = 0x400;
    }
    pcVar4->alloc = __size;
    puVar3 = (uchar *)realloc(pcVar4->data,__size);
    pcVar4 = c->out;
    pcVar4->data = puVar3;
  }
  memcpy(pcVar4->data + pcVar4->byte,in,sVar6);
  pcVar4 = c->out;
  sVar7 = sVar6 + pcVar4->byte;
  pcVar4->byte = sVar7;
  while( true ) {
    uVar2 = pcVar4->alloc;
    if (sVar7 + 1 < uVar2) break;
    auVar9._8_4_ = (int)(uVar2 >> 0x20);
    auVar9._0_8_ = uVar2;
    auVar9._12_4_ = 0x45300000;
    dVar10 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 1.5;
    uVar5 = (ulong)dVar10;
    sVar6 = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
    if (uVar2 == 0) {
      sVar6 = 0x400;
    }
    pcVar4->alloc = sVar6;
    puVar3 = (uchar *)realloc(pcVar4->data,sVar6);
    pcVar4 = c->out;
    pcVar4->data = puVar3;
    sVar7 = pcVar4->byte;
  }
  uVar1 = (c->field_6).byte_array_stop.stop;
  pcVar4->byte = sVar7 + 1;
  pcVar4->data[sVar7] = uVar1;
  return 0;
}

Assistant:

int cram_byte_array_stop_encode(cram_slice *slice, cram_codec *c,
				char *in, int in_size) {
    BLOCK_APPEND(c->out, in, in_size);
    BLOCK_APPEND_CHAR(c->out, c->e_byte_array_stop.stop);
    return 0;
}